

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
peek(Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  runtime_error *this_00;
  string *psVar3;
  ParseLocation l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ParseLocation local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  local_58;
  
  if (this->future == 0) {
    (*(this->super_RefCount)._vptr_RefCount[5])(&local_78,this);
    (*(this->super_RefCount)._vptr_RefCount[4])(&local_98,this);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_embree::ParseLocation_&,_true>
              (&local_58,&local_98,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (local_78.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    sVar1 = this->past;
    sVar2 = this->future;
    if (sVar2 + sVar1 == 0x400) {
      if (sVar1 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this->start = (ulong)((int)this->start + 1U & 0x3ff);
      this->past = sVar1 - 1;
    }
    this->future = sVar2 + 1;
    psVar3 = (string *)
             ((long)&(((this->buffer).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
             (ulong)(((int)sVar2 + (int)this->start + (int)this->past & 0x3ffU) << 6));
    std::__cxx11::string::_M_assign(psVar3);
    *(element_type **)(psVar3 + 0x20) =
         local_58.second.fileName.
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(psVar3 + 0x28),
               &local_58.second.fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    *(ssize_t *)(psVar3 + 0x30) = local_58.second.lineNumber;
    *(ssize_t *)(psVar3 + 0x38) = local_58.second.colNumber;
    if (local_58.second.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.second.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
      operator_delete(local_58.first._M_dataplus._M_p);
    }
  }
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&(((this->buffer).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
         (ulong)(((int)this->past + (int)this->start & 0x3ffU) << 6));
}

Assistant:

const T& peek() {
      if (future == 0) push_back(nextHelper());
      return buffer[(start+past)%BUF_SIZE].first;
    }